

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_char32At_63(UText *ut,int64_t nativeIndex)

{
  UChar UVar1;
  long lVar2;
  int iVar3;
  UChar32 UVar4;
  uint uVar5;
  
  lVar2 = ut->chunkNativeStart;
  uVar5 = 0xffffffff;
  iVar3 = (int)nativeIndex - (int)lVar2;
  if ((lVar2 <= nativeIndex) && (nativeIndex < lVar2 + ut->nativeIndexingLimit)) {
    ut->chunkOffset = iVar3;
    UVar1 = ut->chunkContents[iVar3];
    uVar5 = (uint)(ushort)UVar1;
    if ((UVar1 & 0xf800U) != 0xd800) {
      return (uint)(ushort)UVar1;
    }
  }
  utext_setNativeIndex_63(ut,nativeIndex);
  if (((ut->chunkNativeStart <= nativeIndex) && (ut->chunkOffset < ut->chunkLength)) &&
     (uVar5 = (uint)(ushort)ut->chunkContents[ut->chunkOffset],
     (ut->chunkContents[ut->chunkOffset] & 0xf800U) == 0xd800)) {
    UVar4 = utext_current32_63(ut);
    return UVar4;
  }
  return uVar5;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_char32At(UText *ut, int64_t nativeIndex) {
    UChar32 c = U_SENTINEL;

    // Fast path the common case.
    if (nativeIndex>=ut->chunkNativeStart && nativeIndex < ut->chunkNativeStart + ut->nativeIndexingLimit) {
        ut->chunkOffset = (int32_t)(nativeIndex - ut->chunkNativeStart);
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c) == FALSE) {
            return c;
        }
    }


    utext_setNativeIndex(ut, nativeIndex);
    if (nativeIndex>=ut->chunkNativeStart && ut->chunkOffset<ut->chunkLength) {
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c)) {
            // For surrogates, let current32() deal with the complications
            //    of supplementaries that may span chunk boundaries.
            c = utext_current32(ut);
        }
    }
    return c;
}